

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

double __thiscall slang::SVInt::toDouble(SVInt *this)

{
  uint uVar1;
  byte bVar2;
  logic_t lVar3;
  bitwidth_t bVar4;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar5;
  char cVar6;
  uint uVar7;
  bool bVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  double extraout_XMM0_Qb;
  undefined1 auVar13 [16];
  optional<long> oVar14;
  optional<unsigned_long> oVar15;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_48;
  uint local_40;
  char local_3c;
  byte local_3b;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_38;
  uint local_30;
  byte local_2b;
  double local_28;
  double dStack_20;
  
  SVInt((SVInt *)&local_48,&this->super_SVIntStorage);
  if (local_3b == 1) {
    flattenUnknowns((SVInt *)&local_48);
  }
  if (local_3c == '\x01') {
    oVar14 = as<long>((SVInt *)&local_48);
    if (((undefined1  [16])
         oVar14.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>
        & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      local_28 = (double)oVar14.super__Optional_base<long,_true,_true>._M_payload.
                         super__Optional_payload_base<long>._M_payload;
      dStack_20 = extraout_XMM0_Qb;
      goto LAB_002c3cfc;
    }
  }
  else {
    oVar15 = as<unsigned_long>((SVInt *)&local_48);
    if (((undefined1  [16])
         oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
        (undefined1  [16])0x0) {
      auVar13._8_4_ =
           oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload._4_4_;
      auVar13._0_8_ =
           oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_long>._M_payload;
      auVar13._12_4_ = 0x45300000;
      dStack_20 = auVar13._8_8_ - 1.9342813113834067e+25;
      local_28 = dStack_20 +
                 ((double)CONCAT44(0x43300000,
                                   oVar15.super__Optional_base<unsigned_long,_true,_true>._M_payload
                                   .super__Optional_payload_base<unsigned_long>._M_payload._0_4_) -
                 4503599627370496.0);
      goto LAB_002c3cfc;
    }
  }
  if (local_3c == '\x01') {
    lVar3 = operator[]((SVInt *)&local_48,local_40 - 1);
    bVar8 = (lVar3.value & 0x7f) != 0 && lVar3.value != '@';
  }
  else {
    bVar8 = false;
  }
  if (bVar8) {
    operator-((SVInt *)&local_38);
    operator=((SVInt *)&local_48,(SVInt *)&local_38);
    if (((0x40 < local_30) || ((local_2b & 1) != 0)) && ((void *)local_38.val != (void *)0x0)) {
      operator_delete__(local_38.pVal);
    }
  }
  bVar4 = getActiveBits((SVInt *)&local_48);
  uVar1 = bVar4 - 1;
  uVar10 = uVar1 >> 6;
  uVar7 = 0x40;
  if ((bVar4 & 0x3f) != 0) {
    uVar7 = bVar4 & 0x3f;
  }
  aVar5.pVal = (uint64_t *)&local_48;
  if ((local_3b & 1) != 0) {
    aVar5 = local_48;
  }
  if (0x40 < local_40) {
    aVar5 = local_48;
  }
  uVar9 = aVar5.pVal[uVar10];
  cVar6 = (char)uVar7;
  if (uVar1 < 0x40 || 0x34 < uVar7) {
    if (uVar7 < 0x36) {
      uVar12 = 1;
      uVar11 = 0;
    }
    else {
      uVar11 = ~(-1L << (cVar6 - 0x35U & 0x3f)) & uVar9;
      uVar12 = 1L << (cVar6 - 0x36U & 0x3f);
      uVar9 = uVar9 >> (cVar6 - 0x35U & 0x3f);
    }
  }
  else {
    uVar10 = uVar10 - 1;
    bVar2 = cVar6 + 0xbU & 0x3f;
    uVar9 = aVar5.pVal[uVar10] >> bVar2 | uVar9 << 0x40 - bVar2;
    uVar11 = ~(-1L << (cVar6 + 0xbU & 0x3f)) & aVar5.pVal[uVar10];
    uVar12 = 1L << (cVar6 + 10U & 0x3f);
  }
  if (uVar12 < uVar11) {
LAB_002c3c5b:
    uVar9 = uVar9 + 1;
  }
  else if (uVar11 == uVar12) {
    if ((uVar9 & 1) != 0) goto LAB_002c3c5b;
    if (uVar10 != 0) {
      aVar5.pVal = (uint64_t *)&local_48;
      if ((local_3b & 1) != 0) {
        aVar5 = local_48;
      }
      if (0x40 < local_40) {
        aVar5 = local_48;
      }
      uVar9 = uVar9 | aVar5.pVal[uVar10 - 1] != 0;
    }
  }
  uVar11 = (ulong)(uVar9 == 0x20000000000000) + (ulong)uVar1;
  if (uVar11 < 0x400) {
    local_28 = (double)((uVar9 & 0xfffffffffffff | uVar11 << 0x34 | (ulong)bVar8 << 0x3f) +
                       0x3ff0000000000000);
    dStack_20 = 0.0;
  }
  else if (bVar8) {
    local_28 = -INFINITY;
    dStack_20 = 0.0;
  }
  else {
    local_28 = INFINITY;
    dStack_20 = 0.0;
  }
LAB_002c3cfc:
  if (((0x40 < local_40) || ((local_3b & 1) != 0)) &&
     ((undefined1 *)local_48.val != (undefined1 *)0x0)) {
    operator_delete__(local_48.pVal);
  }
  return local_28;
}

Assistant:

double SVInt::toDouble() const {
    return toIEEE754<double, 11, 52, 1023>(*this);
}